

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_pred_weight_table_entry
              (bitstream *str,h264_pred_weight_table *table,h264_pred_weight_table_entry *entry)

{
  uint uVar1;
  uint uVar2;
  bitstream *in_RDX;
  int ret;
  int32_t in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  uint uVar3;
  
  uVar3 = 0;
  uVar1 = vs_u(in_RDX,(uint32_t *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  uVar1 = uVar1 | uVar3;
  if (in_RDX->dir == VS_ENCODE) {
    uVar3 = vs_infers(in_RDX,(int32_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    uVar3 = uVar3 | uVar1;
    uVar1 = vs_infers(in_RDX,(int32_t *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    uVar1 = uVar1 | uVar3;
  }
  else {
    uVar3 = vs_se(in_RDX,(int32_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
    uVar3 = uVar3 | uVar1;
    uVar1 = vs_se(in_RDX,(int32_t *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
    uVar1 = uVar1 | uVar3;
  }
  uVar3 = vs_u(in_RDX,(uint32_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  uVar3 = uVar3 | uVar1;
  if (*(int *)((long)&in_RDX->bytes + 4) == 0) {
    uVar1 = vs_infers(in_RDX,(int32_t *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    uVar1 = uVar1 | uVar3;
    uVar3 = vs_infers(in_RDX,(int32_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    uVar3 = uVar3 | uVar1;
    uVar2 = vs_infers(in_RDX,(int32_t *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    uVar2 = uVar2 | uVar3;
    uVar1 = vs_infers(in_RDX,(int32_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    uVar1 = uVar1 | uVar2;
  }
  else {
    uVar1 = vs_se(in_RDX,(int32_t *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
    uVar1 = uVar1 | uVar3;
    uVar3 = vs_se(in_RDX,(int32_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
    uVar3 = uVar3 | uVar1;
    uVar2 = vs_se(in_RDX,(int32_t *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
    uVar2 = uVar2 | uVar3;
    uVar1 = vs_se(in_RDX,(int32_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    uVar1 = uVar1 | uVar2;
  }
  return uVar1;
}

Assistant:

int h264_pred_weight_table_entry(struct bitstream *str, struct h264_pred_weight_table *table, struct h264_pred_weight_table_entry *entry) {
	int ret = 0;
	ret |= vs_u(str, &entry->luma_weight_flag, 1);
	if (entry->luma_weight_flag) {
		ret |= vs_se(str, &entry->luma_weight);
		ret |= vs_se(str, &entry->luma_offset);
	} else {
		ret |= vs_infers(str, &entry->luma_weight, 1 << table->luma_log2_weight_denom);
		ret |= vs_infers(str, &entry->luma_offset, 0);
	}
	ret |= vs_u(str, &entry->chroma_weight_flag, 1);
	if (entry->chroma_weight_flag) {
		ret |= vs_se(str, &entry->chroma_weight[0]);
		ret |= vs_se(str, &entry->chroma_offset[0]);
		ret |= vs_se(str, &entry->chroma_weight[1]);
		ret |= vs_se(str, &entry->chroma_offset[1]);
	} else {
		ret |= vs_infers(str, &entry->chroma_weight[0], 1 << table->chroma_log2_weight_denom);
		ret |= vs_infers(str, &entry->chroma_offset[0], 0);
		ret |= vs_infers(str, &entry->chroma_weight[1], 1 << table->chroma_log2_weight_denom);
		ret |= vs_infers(str, &entry->chroma_offset[1], 0);
	}
	return ret;
}